

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnishingElementType,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcFurnishingElementType *in;
  
  in = (IfcFurnishingElementType *)operator_new(0x1a8);
  *(undefined ***)&(in->super_IfcElementType).field_0x190 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x198 = 0;
  *(char **)&in->field_0x1a0 = "IfcFurnishingElementType";
  Assimp::IFC::Schema_2x3::IfcElementType::IfcElementType
            ((IfcElementType *)in,&PTR_construction_vtable_24__0087f158);
  *(undefined ***)&(in->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject =
       &PTR__IfcFurnishingElementType_0087f050;
  *(undefined ***)&(in->super_IfcElementType).field_0x190 = &PTR__IfcFurnishingElementType_0087f140;
  *(undefined ***)&(in->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       &PTR__IfcFurnishingElementType_0087f078;
  (in->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFurnishingElementType_0087f0a0;
  *(undefined ***)&(in->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       &PTR__IfcFurnishingElementType_0087f0c8;
  *(undefined ***)&(in->super_IfcElementType).super_IfcTypeProduct.field_0x148 =
       &PTR__IfcFurnishingElementType_0087f0f0;
  *(undefined ***)&(in->super_IfcElementType).field_0x180 = &PTR__IfcFurnishingElementType_0087f118;
  GenericFill<Assimp::IFC::Schema_2x3::IfcFurnishingElementType>(db,params,in);
  return (Object *)
         (&(in->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject +
                  -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }